

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetBufferDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,BufferDesc *Desc)

{
  ulong uVar1;
  bool bVar2;
  char *in_RCX;
  Uint32 CpuAccessFlags;
  String SStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar1 = *(ulong *)(this + 8);
  if (uVar1 < 0x100001) {
    if (uVar1 < 0x401) {
      bVar2 = false;
      goto LAB_0027fa43;
    }
    ToString<unsigned_long>(&SStack_38,uVar1 >> 10);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  else {
    ToString<unsigned_long>(&SStack_38,uVar1 >> 0x14);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  bVar2 = true;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0027fa43:
  ToString<unsigned_long>(&SStack_38,*(unsigned_long *)(this + 8));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetBufferModeString((BUFFER_MODE)this[0x16]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetUsageString((USAGE)this[0x14]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetBindFlagsString_abi_cxx11_
            (&SStack_38,(Diligent *)(ulong)*(uint *)(this + 0x10),0x2e0af3,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetCPUAccessFlagsString_abi_cxx11_(&SStack_38,(Diligent *)(ulong)(byte)this[0x15],CpuAccessFlags);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x18));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String GetBufferDescString(const BufferDesc& Desc)
{
    String Str;
    Str += "Size: ";
    bool bIsLarge = false;
    if (Desc.Size > (1 << 20))
    {
        Str += ToString(Desc.Size / (1 << 20));
        Str += " Mb (";
        bIsLarge = true;
    }
    else if (Desc.Size > (1 << 10))
    {
        Str += ToString(Desc.Size / (1 << 10));
        Str += " Kb (";
        bIsLarge = true;
    }

    Str += ToString(Desc.Size);
    Str += " bytes";
    if (bIsLarge)
        Str += ')';

    Str += "; Mode: ";
    Str += GetBufferModeString(Desc.Mode);

    Str += "; Usage: ";
    Str += GetUsageString(Desc.Usage);

    Str += "; Bind Flags: ";
    Str += GetBindFlagsString(Desc.BindFlags);

    Str += "; CPU access: ";
    Str += GetCPUAccessFlagsString(Desc.CPUAccessFlags);

    Str += "; stride: ";
    Str += ToString(Desc.ElementByteStride);
    Str += " bytes";

    return Str;
}